

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddrParser.cpp
# Opt level: O0

bool __thiscall axl::io::SockAddrParser::tryAddr_ip4(SockAddrParser *this)

{
  bool bVar1;
  undefined8 in_RDI;
  size_t i;
  bool result;
  ulong uVar2;
  undefined7 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar2 = 0;
  while( true ) {
    bVar1 = tryInt((SockAddrParser *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                   (int)((ulong)in_RDI >> 0x20));
    if (!bVar1) {
      return false;
    }
    if (2 < uVar2) break;
    bVar1 = tryChar((SockAddrParser *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
                    (char)(uVar2 >> 0x38));
    if (!bVar1) {
      return false;
    }
    uVar2 = uVar2 + 1;
  }
  return true;
}

Assistant:

bool
SockAddrParser::tryAddr_ip4() {
	bool result;

	for (size_t i = 0;; i++) {
		result = tryInt(10);
		if (!result)
			return false;

		if (i >= 3)
			break;

		result = tryChar('.');
		if (!result)
			return false;
	}

	return true;
}